

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O2

aiMesh * __thiscall Assimp::ColladaLoader::findMesh(ColladaLoader *this,string *meshid)

{
  pointer ppaVar1;
  __type _Var2;
  uint uVar3;
  ulong uVar4;
  allocator local_59;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = &this->mMeshes;
  uVar3 = 0;
  while( true ) {
    uVar4 = (ulong)uVar3;
    ppaVar1 = (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppaVar1 >> 3) <= uVar4)
    break;
    std::__cxx11::string::string((string *)&local_50,(ppaVar1[uVar4]->mName).data,&local_59);
    _Var2 = std::operator==(&local_50,meshid);
    std::__cxx11::string::~string((string *)&local_50);
    uVar3 = uVar3 + 1;
    if (_Var2) goto LAB_003e2dda;
  }
  local_58 = &this->mTargetMeshes;
  uVar3 = 0;
  do {
    uVar4 = (ulong)uVar3;
    ppaVar1 = (this->mTargetMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->mTargetMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppaVar1 >> 3) <= uVar4) {
      return (aiMesh *)0x0;
    }
    std::__cxx11::string::string((string *)&local_50,(ppaVar1[uVar4]->mName).data,&local_59);
    _Var2 = std::operator==(&local_50,meshid);
    std::__cxx11::string::~string((string *)&local_50);
    uVar3 = uVar3 + 1;
  } while (!_Var2);
LAB_003e2dda:
  return (local_58->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
         super__Vector_impl_data._M_start[uVar4];
}

Assistant:

aiMesh *ColladaLoader::findMesh(const std::string& meshid) {
    for (unsigned int i = 0; i < mMeshes.size(); ++i) {
        if (std::string(mMeshes[i]->mName.data) == meshid) {
            return mMeshes[i];
        }
    }

    for (unsigned int i = 0; i < mTargetMeshes.size(); ++i) {
        if (std::string(mTargetMeshes[i]->mName.data) == meshid) {
            return mTargetMeshes[i];
        }
    }

    return nullptr;
}